

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O0

string * duckdb::StringifyAndFree_abi_cxx11_(yyjson_mut_doc *doc,yyjson_mut_val *object)

{
  char *pcVar1;
  undefined8 uVar2;
  string *in_RDI;
  char *data;
  string *result;
  string *in_stack_ffffffffffffff78;
  yyjson_alc *in_stack_ffffffffffffff80;
  allocator *paVar3;
  undefined8 in_stack_ffffffffffffff88;
  yyjson_mut_doc *in_stack_ffffffffffffff90;
  allocator local_57;
  undefined1 local_56;
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  
  pcVar1 = duckdb_yyjson::yyjson_mut_val_write_opts
                     ((yyjson_mut_val *)in_stack_ffffffffffffff90,
                      (yyjson_write_flag)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                      in_stack_ffffffffffffff80,(usize *)in_stack_ffffffffffffff78,
                      (yyjson_write_err *)0x89f970);
  local_20 = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_56 = 0;
    paVar3 = &local_57;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar1,paVar3);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_57);
    free(local_20);
    duckdb_yyjson::yyjson_mut_doc_free(in_stack_ffffffffffffff90);
    return in_RDI;
  }
  duckdb_yyjson::yyjson_mut_doc_free(in_stack_ffffffffffffff90);
  local_55 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  paVar3 = &local_41;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,"The plan could not be rendered as JSON, yyjson failed",paVar3);
  InternalException::InternalException
            ((InternalException *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_55 = 0;
  __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

static string StringifyAndFree(yyjson_mut_doc *doc, yyjson_mut_val *object) {
	auto data = yyjson_mut_val_write_opts(object, YYJSON_WRITE_ALLOW_INF_AND_NAN | YYJSON_WRITE_PRETTY, nullptr,
	                                      nullptr, nullptr);
	if (!data) {
		yyjson_mut_doc_free(doc);
		throw InternalException("The plan could not be rendered as JSON, yyjson failed");
	}
	auto result = string(data);
	free(data);
	yyjson_mut_doc_free(doc);
	return result;
}